

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 parse_rem(char ***attrib,uint32 *tmat,uint32 *state,uint32 *n_state,uint32 n_read)

{
  uint uVar1;
  uint32 uVar2;
  char *pcVar3;
  char **ppcVar4;
  bool bVar5;
  char *local_48;
  char *tok;
  uint32 i;
  uint max_n_state;
  uint32 n_read_local;
  uint32 *n_state_local;
  uint32 *state_local;
  uint32 *tmat_local;
  char ***attrib_local;
  
  pcVar3 = strtok((char *)0x0," \t");
  ppcVar4 = mk_attrib_list(pcVar3);
  *attrib = ppcVar4;
  pcVar3 = strtok((char *)0x0," \t");
  uVar2 = atoi(pcVar3);
  *tmat = uVar2;
  uVar1 = *n_state;
  tok._4_4_ = 0;
  while( true ) {
    bVar5 = false;
    if (tok._4_4_ < uVar1) {
      local_48 = strtok((char *)0x0," \t");
      bVar5 = local_48 != (char *)0x0;
    }
    if (!bVar5) break;
    if (*local_48 == 'N') {
      state[tok._4_4_] = 0xffffffff;
    }
    else {
      uVar2 = atoi(local_48);
      state[tok._4_4_] = uVar2;
    }
    tok._4_4_ = tok._4_4_ + 1;
  }
  if (uVar1 < tok._4_4_) {
    fflush(_stdout);
    fprintf(_stderr,"%s(%d): number of states for phone exceeds max, %d at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x8d,(ulong)uVar1,(ulong)n_read);
    fflush(_stderr);
    attrib_local._4_4_ = -1;
  }
  else {
    *n_state = tok._4_4_;
    attrib_local._4_4_ = 0;
  }
  return attrib_local._4_4_;
}

Assistant:

static int32
parse_rem(const char ***attrib,
	  uint32 *tmat,
	  uint32 *state,
	  uint32 *n_state,
	  uint32 n_read)
{
    unsigned int max_n_state;
    uint32 i;
    char *tok;

    *attrib = mk_attrib_list(strtok(NULL, " \t"));

    *tmat = atoi(strtok(NULL, " \t"));

    max_n_state = *n_state;

    for (i = 0; (i < max_n_state) && (tok = strtok(NULL, " \t")); i++) {
	if (tok[0] != 'N')
	    state[i] = atoi(tok);
	else
	    state[i] = TYING_NON_EMITTING;
    }
    
    if (i <= max_n_state)
	*n_state = i;
    else {
	fflush(stdout);
	fprintf(stderr, "%s(%d): number of states for phone exceeds max, %d at line %d\n",
		__FILE__, __LINE__,
		max_n_state, n_read);
	fflush(stderr);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}